

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

u8 * dec_bs_get_one_unit(com_bs_t *bs,u8 **next_start)

{
  u8 *puVar1;
  u8 *puVar2;
  u8 *puVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  u8 *puVar10;
  
  puVar1 = bs->cur;
  puVar3 = bs->end + 1;
  iVar4 = (int)puVar3 - (int)puVar1;
  lVar5 = 0;
  bVar6 = 5 < iVar4;
  if (5 < iVar4) {
    iVar7 = iVar4 + -4;
    iVar8 = 0;
    do {
      iVar9 = iVar8;
      if ((~(0x1000100 - *(uint *)(puVar1 + (long)iVar8 + 4) | *(uint *)(puVar1 + (long)iVar8 + 4))
          & 0x80008080) != 0) {
        if (0 < iVar8) {
          iVar8 = iVar8 - (uint)(puVar1[(long)iVar8 + 4] == '\0');
        }
        puVar2 = puVar1 + (long)iVar8 + 5;
        iVar8 = iVar8 + 2;
        do {
          iVar9 = iVar8;
          puVar10 = puVar2;
          iVar8 = iVar9 + 1;
          puVar2 = puVar10 + 1;
        } while (puVar10[-1] != '\0');
        if (((iVar8 < iVar7) && (*puVar10 == '\0')) && (puVar10[1] == '\x01')) {
          lVar5 = (long)(((int)bs->end - (int)puVar1) - iVar8);
          break;
        }
        iVar9 = iVar9 + -5;
      }
      iVar8 = iVar9 + 5;
      bVar6 = iVar9 + 6 < iVar7;
    } while (iVar9 + 6 < iVar7);
  }
  if (bVar6) {
    puVar3 = puVar1 + (iVar4 - lVar5);
  }
  *next_start = puVar3;
  puVar3 = dec_bs_demulate(puVar1 + -1,puVar3);
  return puVar3;
}

Assistant:

u8* dec_bs_get_one_unit(com_bs_t *bs, u8 **next_start)
{
    u8 *start = bs->cur;
    u8 *end   = bs->end + 1;
    int len = (int)(end - start);
    int left_bytes;

    if (dec_bs_find_start_code(start + 4, len - 4, &left_bytes)) {
        end = start + len - left_bytes;
    }

    *next_start = end;

    return dec_bs_demulate(start - 1, end);
}